

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_avx512bw_popcnt32_mask(uint16_t *data,uint32_t len,uint32_t *flags)

{
  ushort uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int i_1;
  undefined1 (*pauVar9) [64];
  int i;
  long lVar10;
  int j;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar37 [64];
  __m512i masks [16];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  pauVar9 = &local_480;
  lVar10 = 0;
  while (lVar10 != 0x10) {
    lVar10 = lVar10 + 1;
    auVar15 = vpbroadcastd_avx512f();
    auVar15 = vmovdqa64_avx512f(auVar15);
    *pauVar9 = auVar15;
    pauVar9 = pauVar9 + 1;
  }
  auVar15 = vmovdqa64_avx512f(local_480);
  auVar16 = vmovdqa64_avx512f(local_440);
  auVar17 = vmovdqa64_avx512f(local_400);
  auVar18 = vmovdqa64_avx512f(local_3c0);
  auVar19 = vmovdqa64_avx512f(local_380);
  auVar20 = vmovdqa64_avx512f(local_340);
  auVar21 = vmovdqa64_avx512f(local_300);
  auVar22 = vmovdqa64_avx512f(local_2c0);
  auVar23 = vmovdqa64_avx512f(local_280);
  auVar24 = vmovdqa64_avx512f(local_240);
  auVar25 = vmovdqa64_avx512f(local_200);
  auVar26 = vmovdqa64_avx512f(local_1c0);
  auVar27 = vmovdqa64_avx512f(local_180);
  auVar28 = vmovdqa64_avx512f(local_140);
  auVar29 = vmovdqa64_avx512f(local_100);
  auVar30 = vmovdqa64_avx512f(local_c0);
  auVar12 = vpxord_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
  auVar37 = ZEXT1664(auVar12);
  lVar10 = 0;
  while ((ulong)(len >> 5) << 6 != lVar10) {
    auVar31 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)data + lVar10));
    lVar10 = lVar10 + 0x40;
    auVar32 = vpandq_avx512f(auVar27,auVar31);
    auVar33 = vpandq_avx512f(auVar29,auVar31);
    auVar34 = vpandq_avx512f(auVar23,auVar31);
    auVar35 = vpandq_avx512f(auVar19,auVar31);
    auVar36 = vpandq_avx512f(auVar15,auVar31);
    uVar2 = vpcmpeqw_avx512bw(auVar32,auVar27);
    auVar32 = vpandq_avx512f(auVar28,auVar31);
    uVar3 = vpcmpeqw_avx512bw(auVar32,auVar28);
    uVar4 = vpcmpeqw_avx512bw(auVar33,auVar29);
    auVar32 = vpandq_avx512f(auVar30,auVar31);
    uVar5 = vpcmpeqw_avx512bw(auVar32,auVar30);
    auVar12 = vpinsrd_avx512dq(ZEXT416((uint)uVar2),(int)uVar3,1);
    auVar32 = vpandq_avx512f(auVar25,auVar31);
    uVar2 = vpcmpeqw_avx512bw(auVar34,auVar23);
    auVar33 = vpandq_avx512f(auVar24,auVar31);
    auVar12 = vpinsrd_avx512dq(auVar12,(int)uVar4,2);
    uVar3 = vpcmpeqw_avx512bw(auVar33,auVar24);
    auVar12 = vpinsrd_avx512dq(auVar12,(int)uVar5,3);
    uVar4 = vpcmpeqw_avx512bw(auVar32,auVar25);
    auVar32 = vpandq_avx512f(auVar26,auVar31);
    uVar5 = vpcmpeqw_avx512bw(auVar32,auVar26);
    auVar6 = vpinsrd_avx512dq(ZEXT416((uint)uVar2),(int)uVar3,1);
    auVar32 = vpandq_avx512f(auVar21,auVar31);
    uVar2 = vpcmpeqw_avx512bw(auVar35,auVar19);
    auVar33 = vpandq_avx512f(auVar20,auVar31);
    auVar6 = vpinsrd_avx512dq(auVar6,(int)uVar4,2);
    uVar3 = vpcmpeqw_avx512bw(auVar33,auVar20);
    auVar6 = vpinsrd_avx512dq(auVar6,(int)uVar5,3);
    uVar4 = vpcmpeqw_avx512bw(auVar32,auVar21);
    auVar32 = vpandq_avx512f(auVar22,auVar31);
    uVar5 = vpcmpeqw_avx512bw(auVar32,auVar22);
    auVar7 = vpinsrd_avx512dq(ZEXT416((uint)uVar2),(int)uVar3,1);
    auVar32 = vpandq_avx512f(auVar17,auVar31);
    uVar2 = vpcmpeqw_avx512bw(auVar36,auVar15);
    auVar33 = vpandq_avx512f(auVar16,auVar31);
    auVar7 = vpinsrd_avx512dq(auVar7,(int)uVar4,2);
    auVar31 = vpandq_avx512f(auVar18,auVar31);
    uVar3 = vpcmpeqw_avx512bw(auVar33,auVar16);
    auVar7 = vpinsrd_avx512dq(auVar7,(int)uVar5,3);
    uVar4 = vpcmpeqw_avx512bw(auVar32,auVar17);
    auVar8 = vpinsrd_avx512dq(ZEXT416((uint)uVar2),(int)uVar3,1);
    uVar2 = vpcmpeqw_avx512bw(auVar31,auVar18);
    auVar8 = vpinsrd_avx512dq(auVar8,(int)uVar4,2);
    auVar13 = vinserti32x4_avx512vl(ZEXT1632(auVar6),auVar12,1);
    auVar12 = vpinsrd_avx512dq(auVar8,(int)uVar2,3);
    auVar14 = vinserti32x4_avx512vl(ZEXT1632(auVar12),auVar7,1);
    auVar31 = vinserti64x4_avx512f(ZEXT3264(auVar14),auVar13,1);
    auVar31 = vpopcntd_avx512_vpopcntdq(auVar31);
    auVar37 = vpaddd_avx512f(auVar31,auVar37);
  }
  local_4c0 = vmovdqu64_avx512f(auVar37);
  for (lVar10 = (long)(int)(len & 0xffffffe0); (uint)lVar10 < len; lVar10 = lVar10 + 1) {
    uVar1 = data[lVar10];
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
      *(uint *)(local_4c0 + lVar11 * 4) =
           *(int *)(local_4c0 + lVar11 * 4) + (uint)((uVar1 >> ((uint)lVar11 & 0x1f) & 1) != 0);
    }
  }
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
    flags[lVar10] = *(uint32_t *)(local_4c0 + lVar10 * 4);
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_popcnt32_mask(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m512i masks[16];
    for (int i = 0; i < 16; ++i) {
        masks[i] = _mm512_set1_epi32(((1 << i) << 16) | (1 << i));
    }
    uint32_t out_counters[16] = {0};

    const __m512i* data_vectors = (const __m512i*)(data);
    const uint32_t n_cycles = len / 32;

#define UPDATE(pos) out_counters[pos] += PIL_POPCOUNT((uint64_t)_mm512_cmpeq_epu16_mask(_mm512_and_epi32(_mm512_loadu_si512(data_vectors+i), masks[pos]), masks[pos]));
#define BLOCK {                                 \
    UPDATE(0)  UPDATE(1)  UPDATE(2)  UPDATE(3)  \
    UPDATE(4)  UPDATE(5)  UPDATE(6)  UPDATE(7)  \
    UPDATE(8)  UPDATE(9)  UPDATE(10) UPDATE(11) \
    UPDATE(12) UPDATE(13) UPDATE(14) UPDATE(15) \
}

    for (int i = 0; i < n_cycles; ++i) {
        BLOCK
    }

    // residual
    for (int i = n_cycles*32; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

#undef BLOCK
#undef UPDATE

    return 0;
}